

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O1

SBuf * lj_strfmt_putfnum_uint(SBuf *sb,SFormat sf,lua_Number n)

{
  SBuf *pSVar1;
  
  pSVar1 = lj_strfmt_putfxint(sb,sf,(long)(double)(~-(ulong)(n < 9.223372036854776e+18) &
                                                   (ulong)(n + -1.8446744073709552e+19) |
                                                  (ulong)n & -(ulong)(n < 9.223372036854776e+18)));
  return pSVar1;
}

Assistant:

SBuf *lj_strfmt_putfnum_uint(SBuf *sb, SFormat sf, lua_Number n)
{
  int64_t k;
  if (n >= 9223372036854775808.0)
    k = (int64_t)(n - 18446744073709551616.0);
  else
    k = (int64_t)n;
  return lj_strfmt_putfxint(sb, sf, (uint64_t)k);
}